

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O1

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,cmBTStringRange *entries)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  bool bVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string *psVar6;
  ulong uVar7;
  string *extraout_RDX;
  string *extraout_RDX_00;
  cmDebuggerVariables *this_00;
  ulong __val;
  uint __len;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar8;
  long lVar9;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar10;
  shared_ptr<cmDebugger::cmDebuggerVariables> arrayVariables;
  bool local_e9;
  shared_ptr<cmDebugger::cmDebuggerVariables> local_e8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80;
  shared_ptr<cmDebugger::cmDebuggerVariablesManager> local_60;
  cmDebuggerVariablesHelper *local_50;
  cmBTStringRange *local_48;
  element_type *local_40;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_38;
  
  if ((entries->Begin)._M_current == (entries->End)._M_current) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(undefined8 *)this = 0;
    local_50 = this + 8;
    local_e9 = supportsVariableType;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cmDebugger::cmDebuggerVariables,std::allocator<cmDebugger::cmDebuggerVariables>,std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_50,(cmDebuggerVariables **)this,
               (allocator<cmDebugger::cmDebuggerVariables> *)&local_d8,variablesManager,name,
               &local_e9);
    pBVar8 = (entries->Begin)._M_current;
    local_38 = (entries->End)._M_current;
    local_48 = entries;
    if (pBVar8 != local_38) {
      local_40 = (element_type *)this;
      do {
        pcVar1 = (pBVar8->Value)._M_dataplus._M_p;
        local_d8 = local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar1,pcVar1 + (pBVar8->Value)._M_string_length);
        local_b8 = (pBVar8->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        local_b0 = (pBVar8->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_b0->_M_use_count = local_b0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_b0->_M_use_count = local_b0->_M_use_count + 1;
          }
        }
        local_e8.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xb0);
        p_Var5->_M_use_count = 1;
        p_Var5->_M_weak_count = 1;
        p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b39bb8;
        local_60.
        super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (variablesManager->
                 super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_60.
        super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (variablesManager->
             super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>)
             ._M_refcount._M_pi;
        if (local_60.
            super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60.
             super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.
                  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60.
             super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.
                  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pcVar1 = (pBVar8->Value)._M_dataplus._M_p;
        local_88 = p_Var5;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar1,pcVar1 + (pBVar8->Value)._M_string_length);
        bVar3 = local_e9;
        local_a8._M_unused._M_object = (void *)0x0;
        local_a8._8_8_ = 0;
        local_98 = (code *)0x0;
        pcStack_90 = (code *)0x0;
        psVar6 = (string *)operator_new(0x30);
        *(string **)psVar6 = psVar6 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar6,local_d8,local_d0 + (long)local_d8);
        *(element_type **)(psVar6 + 0x20) = local_b8;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(psVar6 + 0x28) = local_b0;
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_b0->_M_use_count = local_b0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_b0->_M_use_count = local_b0->_M_use_count + 1;
          }
        }
        this_00 = (cmDebuggerVariables *)(p_Var5 + 1);
        pcStack_90 = std::
                     _Function_handler<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariablesHelper.cxx:99:60)>
                     ::_M_invoke;
        local_98 = std::
                   _Function_handler<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariablesHelper.cxx:99:60)>
                   ::_M_manager;
        local_a8._M_unused._0_8_ = (undefined8)psVar6;
        cmDebuggerVariables::cmDebuggerVariables
                  (this_00,&local_60,&local_80,bVar3,
                   (function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
                    *)&local_a8);
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_60.
            super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.
                     super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_e8.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_88;
        local_e8.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = this_00;
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
        }
        this = (cmDebuggerVariablesHelper *)local_40;
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        (local_e8.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->EnableSorting = false;
        cmDebuggerVariables::AddSubVariables
                  ((cmDebuggerVariables *)((element_type *)this)->_vptr_cmDebuggerVariables,
                   &local_e8);
        if (local_e8.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.
                     super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        pBVar8 = pBVar8 + 1;
      } while (pBVar8 != local_38);
    }
    lVar9 = (long)(local_48->End)._M_current - (long)(local_48->Begin)._M_current;
    uVar7 = (lVar9 >> 4) * -0x5555555555555555;
    __val = (lVar9 >> 4) * 0x5555555555555555;
    if (0 < (long)uVar7) {
      __val = uVar7;
    }
    __len = 1;
    if (9 < __val) {
      uVar7 = __val;
      uVar4 = 4;
      do {
        __len = uVar4;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_004ac089;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_004ac089;
        }
        if (uVar7 < 10000) goto LAB_004ac089;
        bVar3 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar4 = __len + 4;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_004ac089:
    pp_Var2 = ((element_type *)this)->_vptr_cmDebuggerVariables;
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(lVar9 < -0x2f) + (char)__len);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((ulong)(lVar9 < -0x2f) + (long)local_d8),__len,__val);
    std::__cxx11::string::_M_assign((string *)(pp_Var2 + 6));
    name = extraout_RDX;
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
      name = extraout_RDX_00;
    }
  }
  sVar10.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  sVar10.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar10.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType,
  cmBTStringRange const& entries)
{
  if (entries.empty()) {
    return {};
  }

  auto sourceEntries = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType);

  for (auto const& entry : entries) {
    auto arrayVariables = std::make_shared<cmDebuggerVariables>(
      variablesManager, entry.Value, supportsVariableType, [=]() {
        cmList items{ entry.Value };
        std::vector<cmDebuggerVariableEntry> ret;
        ret.reserve(items.size());
        int i = 0;
        for (std::string const& item : items) {
          ret.emplace_back("[" + std::to_string(i++) + "]", item);
        }
        return ret;
      });
    arrayVariables->SetEnableSorting(false);
    sourceEntries->AddSubVariables(arrayVariables);
  }

  sourceEntries->SetValue(std::to_string(entries.size()));
  return sourceEntries;
}